

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_initialize_event.cpp
# Opt level: O0

void __thiscall duckdb::PipelineInitializeEvent::Schedule(PipelineInitializeEvent *this)

{
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  *in_RDI;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> tasks;
  value_type *in_stack_ffffffffffffff78;
  pointer in_stack_ffffffffffffff98;
  shared_ptr<duckdb::Task,_true> *in_stack_ffffffffffffffa0;
  enable_shared_from_this<duckdb::Event> *in_stack_ffffffffffffffa8;
  shared_ptr<duckdb::Event,_true> *in_stack_ffffffffffffffb0;
  Pipeline *in_stack_ffffffffffffffb8;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *in_stack_ffffffffffffffe8;
  Event *in_stack_fffffffffffffff0;
  
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)0x99a996);
  shared_ptr<duckdb::Pipeline,_true>::operator*((shared_ptr<duckdb::Pipeline,_true> *)in_RDI);
  enable_shared_from_this<duckdb::Event>::shared_from_this(in_stack_ffffffffffffffa8);
  make_uniq<duckdb::PipelineInitializeTask,duckdb::Pipeline&,duckdb::shared_ptr<duckdb::Event,true>>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  shared_ptr<duckdb::Task,_true>::
  shared_ptr<duckdb::PipelineInitializeTask,_std::default_delete<duckdb::PipelineInitializeTask>,_true,_0>
            (in_stack_ffffffffffffffa0,
             (unique_ptr<duckdb::PipelineInitializeTask,_std::default_delete<duckdb::PipelineInitializeTask>,_true>
              *)in_stack_ffffffffffffff98);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::push_back(in_RDI,in_stack_ffffffffffffff78);
  shared_ptr<duckdb::Task,_true>::~shared_ptr((shared_ptr<duckdb::Task,_true> *)0x99aa02);
  unique_ptr<duckdb::PipelineInitializeTask,_std::default_delete<duckdb::PipelineInitializeTask>,_true>
  ::~unique_ptr((unique_ptr<duckdb::PipelineInitializeTask,_std::default_delete<duckdb::PipelineInitializeTask>,_true>
                 *)0x99aa0c);
  shared_ptr<duckdb::Event,_true>::~shared_ptr((shared_ptr<duckdb::Event,_true> *)0x99aa16);
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)in_RDI,
             (vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&stack0xffffffffffffff90);
  Event::SetTasks(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true>::~vector
            ((vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)0x99aa43);
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true>::~vector
            ((vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)0x99aa4d);
  return;
}

Assistant:

void PipelineInitializeEvent::Schedule() {
	// needs to spawn a task to get the chain of tasks for the query plan going
	vector<shared_ptr<Task>> tasks;
	tasks.push_back(make_uniq<PipelineInitializeTask>(*pipeline, shared_from_this()));
	SetTasks(std::move(tasks));
}